

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

CavsByBdryStatus *
Omega_h::separate_cavities
          (CavsByBdryStatus *__return_storage_ptr__,Mesh *old_mesh,Mesh *new_mesh,Cavs *cavs,
          Int key_dim,LOs *keys2kds,Graph *keys2doms)

{
  Int IVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  Read<int> local_610;
  Read<int> local_600;
  Cavs local_5f0;
  CavsByColor local_5b0;
  Read<int> local_598;
  Read<int> local_588;
  Cavs local_578;
  CavsByColor local_538;
  Read<signed_char> local_520;
  undefined1 local_510 [8];
  Read<int> new_bdry_colors;
  Read<signed_char> new_elems_are_bdry;
  Read<int> old_bdry_colors;
  Read<int> local_4d0;
  Cavs local_4c0;
  CavsByColor local_480;
  undefined1 local_468 [8];
  LOs new_elem_class_ids;
  LOs old_elem_class_ids;
  Read<int> local_408;
  Cavs local_3f8;
  Read<signed_char> local_3b8;
  undefined1 local_3a8 [8];
  LOs touch_cavs2cavs;
  Read<signed_char> local_388;
  undefined1 local_378 [8];
  Bytes cavs_touch_bdry;
  undefined1 local_358 [8];
  Read<signed_char> keys_arent_bdry;
  Read<int> local_328;
  Graph local_318;
  Cavs local_2f8;
  Read<int> local_2b8;
  Cavs local_2a8;
  Read<signed_char> local_268;
  undefined1 local_258 [8];
  LOs bdry_cavs2cavs;
  undefined1 local_238 [8];
  Bytes keys_are_bdry;
  Read<int> local_218;
  Write<signed_char> local_208;
  undefined1 local_1f8 [8];
  Read<signed_char> key_class_dims;
  string local_1e0 [32];
  undefined1 local_1c0 [8];
  Read<signed_char> kd_class_dims;
  Cavs local_160;
  Read<signed_char> local_120;
  undefined1 local_110 [8];
  LOs int_cavs2cavs;
  undefined1 local_f0 [8];
  Read<signed_char> cavs_arent_bdry;
  undefined1 local_d0 [8];
  Bytes cavs_are_bdry;
  Graph local_b0;
  undefined1 local_90 [8];
  Read<int> cavs2nbdry_elems;
  undefined1 local_70 [8];
  Read<int> old_elems_are_bdry;
  undefined1 local_50 [8];
  Read<signed_char> old_elems_are_bdry_i8;
  LOs *keys2kds_local;
  Int key_dim_local;
  Cavs *cavs_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  CavsByBdryStatus *out;
  
  old_elems_are_bdry_i8.write_.shared_alloc_.direct_ptr._7_1_ = 0;
  std::array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
  array(__return_storage_ptr__);
  get_elems_are_bdry((Omega_h *)local_50,old_mesh);
  Read<signed_char>::Read
            ((Read<signed_char> *)&cavs2nbdry_elems.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_50);
  array_cast<int,signed_char>
            ((Omega_h *)local_70,
             (Read<signed_char> *)&cavs2nbdry_elems.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)&cavs2nbdry_elems.write_.shared_alloc_.direct_ptr);
  Graph::Graph(&local_b0,&cavs->keys2old_elems);
  Read<int>::Read((Read<int> *)&cavs_are_bdry.write_.shared_alloc_.direct_ptr,(Read<int> *)local_70)
  ;
  graph_reduce<int>((Omega_h *)local_90,&local_b0,
                    (Read<int> *)&cavs_are_bdry.write_.shared_alloc_.direct_ptr,1,OMEGA_H_SUM);
  Read<int>::~Read((Read<int> *)&cavs_are_bdry.write_.shared_alloc_.direct_ptr);
  Graph::~Graph(&local_b0);
  Read<int>::Read((Read<int> *)&cavs_arent_bdry.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_90);
  each_gt<int>((Omega_h *)local_d0,(Read<int> *)&cavs_arent_bdry.write_.shared_alloc_.direct_ptr,0);
  Read<int>::~Read((Read<int> *)&cavs_arent_bdry.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&int_cavs2cavs.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_d0);
  invert_marks((Omega_h *)local_f0,
               (Read<signed_char> *)&int_cavs2cavs.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)&int_cavs2cavs.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read(&local_120,(Read<signed_char> *)local_f0);
  collect_marked((Omega_h *)local_110,&local_120);
  Read<signed_char>::~Read(&local_120);
  pvVar2 = std::
           array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
           operator[](__return_storage_ptr__,0);
  pvVar3 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::operator[]
                     (pvVar2,0);
  Read<int>::Read((Read<int> *)&stack0xfffffffffffffe90,(Read<int> *)local_110);
  Cavs::Cavs((Cavs *)&kd_class_dims.write_.shared_alloc_.direct_ptr,cavs);
  unmap_cavs(&local_160,(LOs *)&stack0xfffffffffffffe90,
             (Cavs *)&kd_class_dims.write_.shared_alloc_.direct_ptr);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::push_back(pvVar3,&local_160);
  Cavs::~Cavs(&local_160);
  Cavs::~Cavs((Cavs *)&kd_class_dims.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&stack0xfffffffffffffe90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1e0,"class_dim",
             (allocator *)((long)&key_class_dims.write_.shared_alloc_.direct_ptr + 7));
  Mesh::get_array<signed_char>((Mesh *)local_1c0,(Int)old_mesh,(string *)(ulong)(uint)key_dim);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&key_class_dims.write_.shared_alloc_.direct_ptr + 7));
  Read<int>::Read(&local_218,keys2kds);
  Read<signed_char>::Read
            ((Read<signed_char> *)&keys_are_bdry.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_1c0);
  unmap<signed_char>((Omega_h *)&local_208,&local_218,
                     (Read<signed_char> *)&keys_are_bdry.write_.shared_alloc_.direct_ptr,1);
  read<signed_char>((Omega_h *)local_1f8,&local_208);
  Write<signed_char>::~Write(&local_208);
  Read<signed_char>::~Read((Read<signed_char> *)&keys_are_bdry.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_218);
  Read<signed_char>::Read
            ((Read<signed_char> *)&bdry_cavs2cavs.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_1f8);
  IVar1 = Mesh::dim(old_mesh);
  each_lt<signed_char>
            ((Omega_h *)local_238,
             (Read<signed_char> *)&bdry_cavs2cavs.write_.shared_alloc_.direct_ptr,(char)IVar1);
  Read<signed_char>::~Read((Read<signed_char> *)&bdry_cavs2cavs.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read(&local_268,(Read<signed_char> *)local_238);
  collect_marked((Omega_h *)local_258,&local_268);
  Read<signed_char>::~Read(&local_268);
  pvVar2 = std::
           array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
           operator[](__return_storage_ptr__,2);
  pvVar3 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::operator[]
                     (pvVar2,0);
  Read<int>::Read(&local_2b8,(Read<int> *)local_258);
  Cavs::Cavs(&local_2f8,cavs);
  unmap_cavs(&local_2a8,&local_2b8,&local_2f8);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::push_back(pvVar3,&local_2a8);
  Cavs::~Cavs(&local_2a8);
  Cavs::~Cavs(&local_2f8);
  Read<int>::~Read(&local_2b8);
  if (keys2doms != (Graph *)0x0) {
    Read<int>::Read(&local_328,(Read<int> *)local_258);
    Graph::Graph((Graph *)&keys_arent_bdry.write_.shared_alloc_.direct_ptr,keys2doms);
    unmap_graph(&local_318,&local_328,(Graph *)&keys_arent_bdry.write_.shared_alloc_.direct_ptr);
    Graph::operator=(keys2doms,&local_318);
    Graph::~Graph(&local_318);
    Graph::~Graph((Graph *)&keys_arent_bdry.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read(&local_328);
  }
  Read<signed_char>::Read
            ((Read<signed_char> *)&cavs_touch_bdry.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_238);
  invert_marks((Omega_h *)local_358,
               (Read<signed_char> *)&cavs_touch_bdry.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)&cavs_touch_bdry.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read(&local_388,(Read<signed_char> *)local_d0);
  Read<signed_char>::Read
            ((Read<signed_char> *)&touch_cavs2cavs.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_358);
  land_each((Omega_h *)local_378,&local_388,
            (Bytes *)&touch_cavs2cavs.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)&touch_cavs2cavs.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read(&local_388);
  Read<signed_char>::Read(&local_3b8,(Read<signed_char> *)local_378);
  collect_marked((Omega_h *)local_3a8,&local_3b8);
  Read<signed_char>::~Read(&local_3b8);
  pvVar2 = std::
           array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
           operator[](__return_storage_ptr__,1);
  pvVar3 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::operator[]
                     (pvVar2,0);
  Read<int>::Read(&local_408,(Read<int> *)local_3a8);
  Cavs::Cavs((Cavs *)&old_elem_class_ids.write_.shared_alloc_.direct_ptr,cavs);
  unmap_cavs(&local_3f8,&local_408,(Cavs *)&old_elem_class_ids.write_.shared_alloc_.direct_ptr);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::push_back(pvVar3,&local_3f8);
  Cavs::~Cavs(&local_3f8);
  Cavs::~Cavs((Cavs *)&old_elem_class_ids.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_408);
  pvVar2 = std::
           array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
           operator[](__return_storage_ptr__,0);
  pvVar3 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::operator[]
                     (pvVar2,1);
  pvVar2 = std::
           array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
           operator[](__return_storage_ptr__,0);
  pvVar4 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::operator[]
                     (pvVar2,0);
  pvVar5 = std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::operator[](pvVar4,0);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::push_back(pvVar3,pvVar5);
  pvVar2 = std::
           array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
           operator[](__return_storage_ptr__,1);
  pvVar3 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::operator[]
                     (pvVar2,1);
  pvVar2 = std::
           array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
           operator[](__return_storage_ptr__,1);
  pvVar4 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::operator[]
                     (pvVar2,0);
  pvVar5 = std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::operator[](pvVar4,0);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::push_back(pvVar3,pvVar5);
  get_elem_class_ids((Omega_h *)&new_elem_class_ids.write_.shared_alloc_.direct_ptr,old_mesh);
  get_elem_class_ids((Omega_h *)local_468,new_mesh);
  pvVar2 = std::
           array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
           operator[](__return_storage_ptr__,2);
  pvVar3 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::operator[]
                     (pvVar2,0);
  pvVar5 = std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::operator[](pvVar3,0);
  Cavs::Cavs(&local_4c0,pvVar5);
  Read<int>::Read(&local_4d0,(Read<int> *)&new_elem_class_ids.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&old_bdry_colors.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_468);
  separate_by_color(&local_480,&local_4c0,&local_4d0,
                    (LOs *)&old_bdry_colors.write_.shared_alloc_.direct_ptr);
  pvVar2 = std::
           array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
           operator[](__return_storage_ptr__,2);
  pvVar3 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::operator[]
                     (pvVar2,1);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::operator=(pvVar3,&local_480);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector(&local_480);
  Read<int>::~Read((Read<int> *)&old_bdry_colors.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_4d0);
  Cavs::~Cavs(&local_4c0);
  pvVar2 = std::
           array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
           operator[](__return_storage_ptr__,0);
  pvVar3 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::operator[]
                     (pvVar2,2);
  pvVar2 = std::
           array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
           operator[](__return_storage_ptr__,0);
  pvVar4 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::operator[]
                     (pvVar2,0);
  pvVar5 = std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::operator[](pvVar4,0);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::push_back(pvVar3,pvVar5);
  Read<int>::Read((Read<int> *)&new_elems_are_bdry.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_70);
  get_elems_are_bdry((Omega_h *)&new_bdry_colors.write_.shared_alloc_.direct_ptr,new_mesh);
  Read<signed_char>::Read
            (&local_520,(Read<signed_char> *)&new_bdry_colors.write_.shared_alloc_.direct_ptr);
  array_cast<int,signed_char>((Omega_h *)local_510,&local_520);
  Read<signed_char>::~Read(&local_520);
  pvVar2 = std::
           array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
           operator[](__return_storage_ptr__,1);
  pvVar3 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::operator[]
                     (pvVar2,0);
  pvVar5 = std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::operator[](pvVar3,0);
  Cavs::Cavs(&local_578,pvVar5);
  Read<int>::Read(&local_588,(Read<int> *)&new_elems_are_bdry.write_.shared_alloc_.direct_ptr);
  Read<int>::Read(&local_598,(Read<int> *)local_510);
  separate_by_color(&local_538,&local_578,&local_588,&local_598);
  pvVar2 = std::
           array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
           operator[](__return_storage_ptr__,1);
  pvVar3 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::operator[]
                     (pvVar2,2);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::operator=(pvVar3,&local_538);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector(&local_538);
  Read<int>::~Read(&local_598);
  Read<int>::~Read(&local_588);
  Cavs::~Cavs(&local_578);
  pvVar2 = std::
           array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
           operator[](__return_storage_ptr__,2);
  pvVar3 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::operator[]
                     (pvVar2,0);
  pvVar5 = std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::operator[](pvVar3,0);
  Cavs::Cavs(&local_5f0,pvVar5);
  Read<int>::Read(&local_600,(Read<int> *)&new_elem_class_ids.write_.shared_alloc_.direct_ptr);
  Read<int>::Read(&local_610,(Read<int> *)local_468);
  separate_by_color(&local_5b0,&local_5f0,&local_600,&local_610);
  pvVar2 = std::
           array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
           operator[](__return_storage_ptr__,2);
  pvVar3 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::operator[]
                     (pvVar2,2);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::operator=(pvVar3,&local_5b0);
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector(&local_5b0);
  Read<int>::~Read(&local_610);
  Read<int>::~Read(&local_600);
  Cavs::~Cavs(&local_5f0);
  old_elems_are_bdry_i8.write_.shared_alloc_.direct_ptr._7_1_ = 1;
  Read<int>::~Read((Read<int> *)local_510);
  Read<signed_char>::~Read((Read<signed_char> *)&new_bdry_colors.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&new_elems_are_bdry.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)local_468);
  Read<int>::~Read((Read<int> *)&new_elem_class_ids.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)local_3a8);
  Read<signed_char>::~Read((Read<signed_char> *)local_378);
  Read<signed_char>::~Read((Read<signed_char> *)local_358);
  Read<int>::~Read((Read<int> *)local_258);
  Read<signed_char>::~Read((Read<signed_char> *)local_238);
  Read<signed_char>::~Read((Read<signed_char> *)local_1f8);
  Read<signed_char>::~Read((Read<signed_char> *)local_1c0);
  Read<int>::~Read((Read<int> *)local_110);
  Read<signed_char>::~Read((Read<signed_char> *)local_f0);
  Read<signed_char>::~Read((Read<signed_char> *)local_d0);
  Read<int>::~Read((Read<int> *)local_90);
  Read<int>::~Read((Read<int> *)local_70);
  Read<signed_char>::~Read((Read<signed_char> *)local_50);
  if ((old_elems_are_bdry_i8.write_.shared_alloc_.direct_ptr._7_1_ & 1) == 0) {
    std::array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
    ~array(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static CavsByBdryStatus separate_cavities(Mesh* old_mesh, Mesh* new_mesh,
    Cavs cavs, Int key_dim, LOs keys2kds, Graph* keys2doms = nullptr) {
  CavsByBdryStatus out;
  auto old_elems_are_bdry_i8 = get_elems_are_bdry(old_mesh);
  auto old_elems_are_bdry = array_cast<LO>(old_elems_are_bdry_i8);
  auto cavs2nbdry_elems =
      graph_reduce(cavs.keys2old_elems, old_elems_are_bdry, 1, OMEGA_H_SUM);
  auto cavs_are_bdry = each_gt(cavs2nbdry_elems, 0);
  auto cavs_arent_bdry = invert_marks(cavs_are_bdry);
  auto int_cavs2cavs = collect_marked(cavs_arent_bdry);
  out[NOT_BDRY][NO_COLOR].push_back(unmap_cavs(int_cavs2cavs, cavs));
  auto kd_class_dims = old_mesh->get_array<I8>(key_dim, "class_dim");
  auto key_class_dims = read(unmap(keys2kds, kd_class_dims, 1));
  auto keys_are_bdry = each_lt(key_class_dims, I8(old_mesh->dim()));
  auto bdry_cavs2cavs = collect_marked(keys_are_bdry);
  out[KEY_BDRY][NO_COLOR].push_back(unmap_cavs(bdry_cavs2cavs, cavs));
  if (keys2doms) *keys2doms = unmap_graph(bdry_cavs2cavs, *keys2doms);
  auto keys_arent_bdry = invert_marks(keys_are_bdry);
  auto cavs_touch_bdry = land_each(cavs_are_bdry, keys_arent_bdry);
  auto touch_cavs2cavs = collect_marked(cavs_touch_bdry);
  out[TOUCH_BDRY][NO_COLOR].push_back(unmap_cavs(touch_cavs2cavs, cavs));
  out[NOT_BDRY][CLASS_COLOR].push_back(out[NOT_BDRY][NO_COLOR][0]);
  out[TOUCH_BDRY][CLASS_COLOR].push_back(out[TOUCH_BDRY][NO_COLOR][0]);
  auto old_elem_class_ids = get_elem_class_ids(old_mesh);
  auto new_elem_class_ids = get_elem_class_ids(new_mesh);
  out[KEY_BDRY][CLASS_COLOR] = separate_by_color(
      out[KEY_BDRY][NO_COLOR][0], old_elem_class_ids, new_elem_class_ids);
  out[NOT_BDRY][CLASS_BDRY_COLOR].push_back(out[NOT_BDRY][NO_COLOR][0]);
  auto old_bdry_colors = old_elems_are_bdry;
  auto new_elems_are_bdry = get_elems_are_bdry(new_mesh);
  auto new_bdry_colors = array_cast<LO>(new_elems_are_bdry);
  out[TOUCH_BDRY][CLASS_BDRY_COLOR] = separate_by_color(
      out[TOUCH_BDRY][NO_COLOR][0], old_bdry_colors, new_bdry_colors);
  out[KEY_BDRY][CLASS_BDRY_COLOR] = separate_by_color(
      out[KEY_BDRY][NO_COLOR][0], old_elem_class_ids, new_elem_class_ids);
  return out;
}